

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O0

double __thiscall
BayesianGameCollaborativeGraphical::ComputeValueJPol
          (BayesianGameCollaborativeGraphical *this,JointPolicyDiscretePure *jpolBG)

{
  value_type vVar1;
  int iVar2;
  undefined4 extraout_var;
  reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  BayesianGameBase *in_RDI;
  allocator_type *paVar4;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double this_r;
  double p;
  Index actionI;
  Index agI;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs_e;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrTypes_e;
  vector<unsigned_int,_std::allocator<unsigned_int>_> typeIs_e;
  size_t nrAgents_e;
  Scope *agSc;
  double r_e;
  Index e;
  double r;
  size_t nrR;
  size_type in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  allocator_type *in_stack_fffffffffffffe98;
  allocator_type *in_stack_fffffffffffffea0;
  value_type in_stack_fffffffffffffea8;
  value_type in_stack_fffffffffffffeac;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffec8;
  uint local_cc;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c0 [3];
  undefined4 local_74;
  undefined1 local_70 [24];
  size_type local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  double local_30;
  uint local_24;
  double local_20;
  ulong local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_10 = in_RSI;
  iVar2 = (*(in_RDI->super_Interface_ProblemToPolicyDiscretePure).
            super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x15])()
  ;
  local_18 = CONCAT44(extraout_var,iVar2);
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  local_20 = 0.0;
  for (local_24 = 0; local_24 < local_18; local_24 = local_24 + 1) {
    local_30 = 0.0;
    (*(in_RDI->super_Interface_ProblemToPolicyDiscretePure).super_Interface_ProblemToPolicyDiscrete.
      _vptr_Interface_ProblemToPolicyDiscrete[0x16])(&local_50,in_RDI,(ulong)local_24);
    local_38 = &local_50;
    local_58 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_50);
    local_74 = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8b1d88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (in_stack_fffffffffffffeb0,
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (value_type_conflict1 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8b1db9);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_38);
    std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x8b1ddd);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
               CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (allocator_type *)in_stack_fffffffffffffea0);
    std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x8b1e03);
    BayesianGameBase::GetNrTypes(in_RDI);
    IndexTools::RestrictIndividualIndicesToScope<unsigned_long>
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffeb0,
               (Scope *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0);
    do {
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8b1e5f);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (in_stack_fffffffffffffeb0,
                 CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                 (value_type_conflict1 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8b1e8d);
      for (local_cc = 0; paVar4 = auVar6._0_8_, local_cc < local_58; local_cc = local_cc + 1) {
        in_stack_fffffffffffffec8 =
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88);
        vVar1 = *(value_type *)
                 &(in_stack_fffffffffffffec8->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        in_stack_fffffffffffffeb0 = local_10;
        in_stack_fffffffffffffec0 =
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                        in_stack_fffffffffffffe88);
        in_stack_fffffffffffffea8 =
             (**(code **)((in_stack_fffffffffffffeb0->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_start + 0x26))
                       (in_stack_fffffffffffffeb0,vVar1,
                        *(value_type *)
                         &(in_stack_fffffffffffffec0->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start);
        auVar6._8_56_ = extraout_var_00;
        auVar6._0_8_ = extraout_XMM0_Qa;
        in_stack_fffffffffffffeac = in_stack_fffffffffffffea8;
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_c0,(ulong)local_cc);
        *pvVar3 = in_stack_fffffffffffffea8;
      }
      (*(in_RDI->super_Interface_ProblemToPolicyDiscretePure).
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x1b])
                (in_RDI,(ulong)local_24,local_70);
      in_stack_fffffffffffffe98 = paVar4;
      in_stack_fffffffffffffea0 = paVar4;
      (*(in_RDI->super_Interface_ProblemToPolicyDiscretePure).
        super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete[0x20])
                (in_RDI,(ulong)local_24,local_70,local_c0);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = in_stack_fffffffffffffe98;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = paVar4;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_30;
      auVar5 = vfmadd213sd_fma(auVar5,auVar7,auVar8);
      auVar6 = ZEXT1664(auVar5);
      local_30 = auVar5._0_8_;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffe97 =
           IndexTools::Increment(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    } while (((in_stack_fffffffffffffe97 ^ 0xff) & 1) != 0);
    local_20 = local_30 + local_20;
    auVar6 = ZEXT864((ulong)local_20);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffea0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffea0);
    Scope::~Scope((Scope *)0x8b2145);
  }
  return local_20;
}

Assistant:

double BayesianGameCollaborativeGraphical::
ComputeValueJPol(
    const JointPolicyDiscretePure & jpolBG
) const
{
    size_t nrR = GetNrLRFs();
    double r = 0.0; //immediate reward (exact)
    for(Index e=0; e < nrR; e++)
    {
        double r_e = 0.0;
        const Scope & agSc = GetScope(e);
        size_t nrAgents_e = agSc.size();
        vector<Index> typeIs_e(nrAgents_e, 0);
        vector<size_t> nrTypes_e(agSc.size());
        IndexTools::RestrictIndividualIndicesToScope(
            GetNrTypes(), agSc, nrTypes_e);

        do{
            //compute the action specified by jpolBG
            vector<Index> aIs_e(nrAgents_e, 0);
            for(Index i=0; i < nrAgents_e; i++)
            {
                Index agI = agSc.at(i);
                Index actionI = jpolBG.GetActionIndex(agI, typeIs_e.at(i));
                aIs_e[i] = actionI;
            }
            double p = GetProbability(e, typeIs_e);
            double this_r =GetUtility(e, typeIs_e, aIs_e);
            r_e += this_r * p;

        }while(!IndexTools::Increment(typeIs_e, nrTypes_e ) );
        r += r_e;

    }
    return r;    
}